

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

double av1_highbd_estimate_noise_from_single_plane_c
                 (uint16_t *src16,int height,int width,int stride,int bit_depth,int edge_thresh)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  double dVar12;
  int local_88;
  long local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  long local_40;
  int mat [3] [3];
  
  bVar3 = (char)bit_depth - 8;
  iVar8 = (1 << (bVar3 & 0x1f)) >> 1;
  lVar9 = 0;
  local_88 = 0;
  local_70 = 0;
  for (iVar6 = 1; iVar6 < height + -1; iVar6 = iVar6 + 1) {
    local_40 = lVar9;
    for (iVar11 = 1; iVar11 < width + -1; iVar11 = iVar11 + 1) {
      piVar4 = &local_68;
      lVar10 = -1;
      mat[0]._0_8_ = lVar9;
      while (lVar10 != 2) {
        lVar10 = lVar10 + 1;
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          piVar4[lVar7] = (uint)src16[(int)lVar9 + (int)lVar7];
        }
        lVar9 = lVar9 + (ulong)(uint)stride;
        piVar4 = piVar4 + 3;
      }
      iVar1 = (((local_68 + local_50) - local_60) - local_48) + (local_5c - local_54) * 2;
      iVar5 = (((local_60 + local_68) - local_50) - local_48) + (local_64 - local_4c) * 2;
      iVar2 = -iVar1;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = -iVar5;
      if (0 < iVar5) {
        iVar1 = iVar5;
      }
      if (iVar2 + iVar8 + iVar1 >> (bVar3 & 0x1f) < edge_thresh) {
        iVar1 = local_60 + local_68 + local_50 + local_48 +
                (local_64 + local_4c + local_54 + local_5c) * -2 + local_58 * 4;
        iVar5 = -iVar1;
        if (0 < iVar1) {
          iVar5 = iVar1;
        }
        local_70 = local_70 + (iVar5 + iVar8 >> (bVar3 & 0x1f));
        local_88 = local_88 + 1;
      }
      lVar9 = mat[0]._0_8_ + 1;
    }
    lVar9 = local_40 + (ulong)(uint)stride;
  }
  if (local_88 < 0x10) {
    dVar12 = -1.0;
  }
  else {
    dVar12 = ((double)local_70 / (double)(local_88 * 6)) * 1.25331413732;
  }
  return dVar12;
}

Assistant:

double av1_highbd_estimate_noise_from_single_plane_c(const uint16_t *src16,
                                                     int height, int width,
                                                     const int stride,
                                                     int bit_depth,
                                                     int edge_thresh) {
  int64_t accum = 0;
  int count = 0;
  for (int i = 1; i < height - 1; ++i) {
    for (int j = 1; j < width - 1; ++j) {
      // Setup a small 3x3 matrix.
      const int center_idx = i * stride + j;
      int mat[3][3];
      for (int ii = -1; ii <= 1; ++ii) {
        for (int jj = -1; jj <= 1; ++jj) {
          const int idx = center_idx + ii * stride + jj;
          mat[ii + 1][jj + 1] = src16[idx];
        }
      }
      // Compute sobel gradients.
      const int Gx = (mat[0][0] - mat[0][2]) + (mat[2][0] - mat[2][2]) +
                     2 * (mat[1][0] - mat[1][2]);
      const int Gy = (mat[0][0] - mat[2][0]) + (mat[0][2] - mat[2][2]) +
                     2 * (mat[0][1] - mat[2][1]);
      const int Ga = ROUND_POWER_OF_TWO(abs(Gx) + abs(Gy), bit_depth - 8);
      // Accumulate Laplacian.
      if (Ga < edge_thresh) {  // Only count smooth pixels.
        const int v = 4 * mat[1][1] -
                      2 * (mat[0][1] + mat[2][1] + mat[1][0] + mat[1][2]) +
                      (mat[0][0] + mat[0][2] + mat[2][0] + mat[2][2]);
        accum += ROUND_POWER_OF_TWO(abs(v), bit_depth - 8);
        ++count;
      }
    }
  }

  // Return -1.0 (unreliable estimation) if there are too few smooth pixels.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}